

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits_tests.cpp
# Opt level: O0

VersionBitsTester * __thiscall
VersionBitsTester::TestState(VersionBitsTester *this,ThresholdState exp,ThresholdState exp_delayed)

{
  bool bVar1;
  CBlockIndex *pCVar2;
  uint64_t uVar3;
  int in_EDX;
  int in_ESI;
  VersionBitsTester *in_RDI;
  long in_FS_OFFSET;
  ThresholdState got_never;
  ThresholdState got_always;
  ThresholdState got_delayed;
  ThresholdState got;
  int i;
  CBlockIndex *pindex;
  int height;
  char *in_stack_fffffffffffffaf8;
  CBlockIndex *in_stack_fffffffffffffb00;
  char *in_stack_fffffffffffffb08;
  int in_stack_fffffffffffffb14;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffffb18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb28;
  const_string *in_stack_fffffffffffffb30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb38;
  lazy_ostream *in_stack_fffffffffffffb40;
  int *in_stack_fffffffffffffb48;
  undefined1 *in_stack_fffffffffffffb58;
  int local_43c;
  int local_3cc;
  const_string local_3a0;
  lazy_ostream local_390 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  const_string local_338;
  lazy_ostream local_328 [2];
  assertion_result local_308;
  undefined1 local_2e0 [16];
  const_string local_2d0;
  lazy_ostream local_2c0 [2];
  assertion_result local_2a0 [2];
  const_string local_268;
  lazy_ostream local_258 [2];
  assertion_result local_238 [2];
  int local_200;
  undefined1 local_1fc [92];
  undefined1 local_1a0 [16];
  undefined1 local_190 [64];
  undefined1 local_150 [4];
  undefined1 local_14c [324];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI != in_EDX) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
                 (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                 (size_t)in_stack_fffffffffffffb28,(const_string *)in_stack_fffffffffffffb20);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffb00,(char (*) [1])in_stack_fffffffffffffaf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
                 (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
      local_1fc._88_4_ = 3;
      in_stack_fffffffffffffb08 = "ThresholdState::ACTIVE";
      in_stack_fffffffffffffb00 = (CBlockIndex *)(local_1fc + 0x58);
      in_stack_fffffffffffffaf8 = "exp";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ThresholdState,ThresholdState>
                (local_190,local_1a0,0x9a,1,2,local_14c);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffffaf8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
                 (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                 (size_t)in_stack_fffffffffffffb28,(const_string *)in_stack_fffffffffffffb20);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffb00,(char (*) [1])in_stack_fffffffffffffaf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
                 (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
      local_1fc._0_4_ = 2;
      in_stack_fffffffffffffb08 = "ThresholdState::LOCKED_IN";
      in_stack_fffffffffffffb00 = (CBlockIndex *)local_1fc;
      in_stack_fffffffffffffaf8 = "exp_delayed";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ThresholdState,ThresholdState>
                (local_1fc + 0x14,local_1fc + 4,0x9b,1,2,local_150);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffffaf8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  pCVar2 = Tip((VersionBitsTester *)in_stack_fffffffffffffb08);
  for (local_3cc = 0; local_3cc < 6; local_3cc = local_3cc + 1) {
    uVar3 = RandomMixin<FastRandomContext>::randbits
                      (in_stack_fffffffffffffb18,in_stack_fffffffffffffb14);
    if (uVar3 == 0) {
      TestConditionChecker::GetStateFor
                ((TestConditionChecker *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
      TestConditionChecker::GetStateFor
                ((TestConditionChecker *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
      TestConditionChecker::GetStateFor
                ((TestConditionChecker *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
      TestConditionChecker::GetStateFor
                ((TestConditionChecker *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
      if (pCVar2 == (CBlockIndex *)0x0) {
        local_43c = 0;
      }
      else {
        local_43c = pCVar2->nHeight + 1;
      }
      local_200 = local_43c;
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
                   (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                   (size_t)in_stack_fffffffffffffb28,(const_string *)in_stack_fffffffffffffb20);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffffb08,
                   SUB81((ulong)in_stack_fffffffffffffb00 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        StateName_abi_cxx11_((ThresholdState)((ulong)in_stack_fffffffffffffb58 >> 0x20));
        StateName_abi_cxx11_((ThresholdState)((ulong)in_stack_fffffffffffffb58 >> 0x20));
        tinyformat::format<int,std::__cxx11::string,int,std::__cxx11::string>
                  ((char *)in_stack_fffffffffffffb48,(int *)in_stack_fffffffffffffb40,
                   in_stack_fffffffffffffb38,(int *)in_stack_fffffffffffffb30,
                   in_stack_fffffffffffffb28);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_fffffffffffffb00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
                   (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
        in_stack_fffffffffffffaf8 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_238,local_258,&local_268,0xa8,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_fffffffffffffaf8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffaf8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
                   (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                   (size_t)in_stack_fffffffffffffb28,(const_string *)in_stack_fffffffffffffb20);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffffb08,
                   SUB81((ulong)in_stack_fffffffffffffb00 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        StateName_abi_cxx11_((ThresholdState)((ulong)in_stack_fffffffffffffb58 >> 0x20));
        StateName_abi_cxx11_((ThresholdState)((ulong)in_stack_fffffffffffffb58 >> 0x20));
        tinyformat::format<int,std::__cxx11::string,int,std::__cxx11::string>
                  ((char *)in_stack_fffffffffffffb48,(int *)in_stack_fffffffffffffb40,
                   in_stack_fffffffffffffb38,(int *)in_stack_fffffffffffffb30,
                   in_stack_fffffffffffffb28);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_fffffffffffffb00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
                   (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
        in_stack_fffffffffffffaf8 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_2a0,local_2c0,&local_2d0,0xa9,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_fffffffffffffaf8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffaf8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      do {
        in_stack_fffffffffffffb58 = local_2e0;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
                   (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                   (size_t)in_stack_fffffffffffffb28,(const_string *)in_stack_fffffffffffffb20);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffffb08,
                   SUB81((ulong)in_stack_fffffffffffffb00 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        in_stack_fffffffffffffb48 = &in_RDI->num;
        StateName_abi_cxx11_((ThresholdState)((ulong)in_stack_fffffffffffffb58 >> 0x20));
        tinyformat::format<int,int,std::__cxx11::string>
                  ((char *)in_stack_fffffffffffffb38,(int *)in_stack_fffffffffffffb30,
                   (int *)in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_fffffffffffffb00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
                   (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
        in_stack_fffffffffffffaf8 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion(&local_308,local_328,&local_338,0xaa,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_fffffffffffffaf8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffaf8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      do {
        in_stack_fffffffffffffb30 = (const_string *)&local_358.field_2;
        in_stack_fffffffffffffb28 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
                   (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
        in_stack_fffffffffffffb38 = &local_358;
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                   (size_t)in_stack_fffffffffffffb28,(const_string *)in_stack_fffffffffffffb20);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffffb08,
                   SUB81((ulong)in_stack_fffffffffffffb00 >> 0x38,0));
        in_stack_fffffffffffffb40 = boost::unit_test::lazy_ostream::instance();
        in_stack_fffffffffffffb20 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_RDI->num;
        StateName_abi_cxx11_((ThresholdState)((ulong)in_stack_fffffffffffffb58 >> 0x20));
        tinyformat::format<int,int,std::__cxx11::string>
                  ((char *)in_stack_fffffffffffffb38,(int *)in_stack_fffffffffffffb30,
                   (int *)in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_fffffffffffffb00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
                   (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
        in_stack_fffffffffffffaf8 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&stack0xfffffffffffffc90,local_390,&local_3a0,0xab,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_fffffffffffffaf8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaf8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffaf8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
  }
  in_RDI->num = in_RDI->num + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

VersionBitsTester& TestState(ThresholdState exp, ThresholdState exp_delayed)
    {
        if (exp != exp_delayed) {
            // only expected differences are that delayed stays in locked_in longer
            BOOST_CHECK_EQUAL(exp, ThresholdState::ACTIVE);
            BOOST_CHECK_EQUAL(exp_delayed, ThresholdState::LOCKED_IN);
        }

        const CBlockIndex* pindex = Tip();
        for (int i = 0; i < CHECKERS; i++) {
            if (m_rng.randbits(i) == 0) {
                ThresholdState got = checker[i].GetStateFor(pindex);
                ThresholdState got_delayed = checker_delayed[i].GetStateFor(pindex);
                ThresholdState got_always = checker_always[i].GetStateFor(pindex);
                ThresholdState got_never = checker_never[i].GetStateFor(pindex);
                // nHeight of the next block. If vpblock is empty, the next (ie first)
                // block should be the genesis block with nHeight == 0.
                int height = pindex == nullptr ? 0 : pindex->nHeight + 1;
                BOOST_CHECK_MESSAGE(got == exp, strprintf("Test %i for %s height %d (got %s)", num, StateName(exp), height, StateName(got)));
                BOOST_CHECK_MESSAGE(got_delayed == exp_delayed, strprintf("Test %i for %s height %d (got %s; delayed case)", num, StateName(exp_delayed), height, StateName(got_delayed)));
                BOOST_CHECK_MESSAGE(got_always == ThresholdState::ACTIVE, strprintf("Test %i for ACTIVE height %d (got %s; always active case)", num, height, StateName(got_always)));
                BOOST_CHECK_MESSAGE(got_never == ThresholdState::FAILED, strprintf("Test %i for FAILED height %d (got %s; never active case)", num, height, StateName(got_never)));
            }
        }
        num++;
        return *this;
    }